

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

M44f * anon_unknown.dwarf_4210c::matrixEulerMatrix_1(M44f *M,Order order)

{
  int in_EDX;
  Vec3<float> *in_RDI;
  V3f f;
  Euler<float> *in_stack_00000068;
  Vec3<float> *in_stack_00000138;
  Matrix44<float> *in_stack_00000140;
  Vec3<float> *v;
  Euler<float> *in_stack_ffffffffffffffd0;
  Vec3<float> local_20;
  int local_14;
  
  v = in_RDI;
  local_14 = in_EDX;
  Imath_3_2::Vec3<float>::Vec3(&local_20);
  if (local_14 == 0x101) {
    Imath_3_2::extractEulerXYZ<float>(in_stack_00000140,in_stack_00000138);
  }
  else {
    Imath_3_2::extractEulerZYX<float>(in_stack_00000140,in_stack_00000138);
  }
  Imath_3_2::Euler<float>::Euler
            (in_stack_ffffffffffffffd0,v,(Order)((ulong)in_RDI >> 0x20),(InputLayout)in_RDI);
  Imath_3_2::Euler<float>::toMatrix44(in_stack_00000068);
  return (M44f *)v;
}

Assistant:

M44f
matrixEulerMatrix_1 (const M44f& M, Eulerf::Order order)
{
    V3f f;

    if (order == Eulerf::XYZ)
        extractEulerXYZ (M, f);
    else
        extractEulerZYX (M, f);

    return Eulerf (f, order).toMatrix44 ();
}